

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool __thiscall argparse::Argument::operator==(Argument *this,bool *aRhs)

{
  bool bVar1;
  bool *aRhs_local;
  Argument *this_local;
  
  bVar1 = get<bool>(this);
  return bVar1 == (bool)(*aRhs & 1U);
}

Assistant:

bool operator==(const T &aRhs) const {
    if constexpr (!details::is_container_v<T>) {
      return get<T>() == aRhs;
    } else {
      using ValueType = typename T::value_type;
      auto tLhs = get<T>();
      return std::equal(std::begin(tLhs), std::end(tLhs), std::begin(aRhs),
                        std::end(aRhs), [](const auto &lhs, const auto &rhs) {
                          return std::any_cast<const ValueType &>(lhs) == rhs;
                        });
    }
  }